

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datumtest.cpp
# Opt level: O1

int testDatumPushPopStringArray(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  string *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  VRStringArray b;
  VRDatumStringArray a;
  VRStringArray c;
  VRStringArray g;
  VRStringArray f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  int local_128;
  int local_124;
  _func_int **local_120;
  VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
  local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_128 = 0;
  iVar11 = 10;
  local_120 = (_func_int **)&PTR__VRDatumSpecialized_0014a778;
  do {
    paVar13 = &local_148.field_2;
    psVar12 = &local_118.super_VRDatum.description;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.super_VRDatum._vptr_VRDatum = (_func_int **)psVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"one","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118);
    if ((string *)local_118.super_VRDatum._vptr_VRDatum != psVar12) {
      operator_delete(local_118.super_VRDatum._vptr_VRDatum,
                      (ulong)(local_118.super_VRDatum.description._M_dataplus._M_p + 1));
    }
    local_118.super_VRDatum._vptr_VRDatum = (_func_int **)psVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"two","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118);
    if ((string *)local_118.super_VRDatum._vptr_VRDatum != psVar12) {
      operator_delete(local_118.super_VRDatum._vptr_VRDatum,
                      (ulong)(local_118.super_VRDatum.description._M_dataplus._M_p + 1));
    }
    local_118.super_VRDatum._vptr_VRDatum = (_func_int **)psVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"three","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118);
    if ((string *)local_118.super_VRDatum._vptr_VRDatum != psVar12) {
      operator_delete(local_118.super_VRDatum._vptr_VRDatum,
                      (ulong)(local_118.super_VRDatum.description._M_dataplus._M_p + 1));
    }
    local_118.super_VRDatum._vptr_VRDatum = (_func_int **)psVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"four","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118);
    if ((string *)local_118.super_VRDatum._vptr_VRDatum != psVar12) {
      operator_delete(local_118.super_VRDatum._vptr_VRDatum,
                      (ulong)(local_118.super_VRDatum.description._M_dataplus._M_p + 1));
    }
    local_118.super_VRDatum._vptr_VRDatum = (_func_int **)psVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"five","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118);
    if ((string *)local_118.super_VRDatum._vptr_VRDatum != psVar12) {
      operator_delete(local_118.super_VRDatum._vptr_VRDatum,
                      (ulong)(local_118.super_VRDatum.description._M_dataplus._M_p + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_60,&local_78);
    MinVR::VRDatumStringArray::VRDatumStringArray((VRDatumStringArray *)&local_118,&local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
    local_118.needPush = true;
    local_118.stackFrame = local_118.stackFrame + 1;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"six","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               &local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar13) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    local_148._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"seven","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               &local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar13) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    local_148._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"eight","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               &local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar13) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    local_148._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"nine","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               &local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar13) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    local_148._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"ten","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               &local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar13) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,&local_98);
    MinVR::
    VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
    ::setValue(&local_118,&local_48);
    local_124 = iVar11;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    (**(code **)((undefined1 *)((long)local_118.super_VRDatum._vptr_VRDatum + 0x60) + 0x18))
              (&local_148,&local_118);
    iVar1 = std::__cxx11::string::compare(local_148._M_dataplus._M_p);
    iVar2 = std::__cxx11::string::compare(local_148._M_dataplus._M_p + 0x20);
    iVar3 = std::__cxx11::string::compare(local_148._M_dataplus._M_p + 0x40);
    iVar4 = std::__cxx11::string::compare(local_148._M_dataplus._M_p + 0x60);
    iVar5 = std::__cxx11::string::compare(local_148._M_dataplus._M_p + 0x80);
    MinVR::
    VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
    ::pop(&local_118);
    (**(code **)((undefined1 *)((long)local_118.super_VRDatum._vptr_VRDatum + 0x60) + 0x18))
              (&local_b0,&local_118);
    iVar11 = local_124;
    iVar1 = iVar1 + local_128;
    iVar6 = std::__cxx11::string::compare
                      ((char *)local_b0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    iVar7 = std::__cxx11::string::compare
                      ((char *)(local_b0.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1));
    iVar8 = std::__cxx11::string::compare
                      ((char *)(local_b0.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2));
    iVar9 = std::__cxx11::string::compare
                      ((char *)(local_b0.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 3));
    iVar10 = std::__cxx11::string::compare
                       ((char *)(local_b0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 4));
    local_128 = iVar10 + iVar9 + iVar8 + iVar7 + iVar5 + iVar6 + iVar3 + iVar4 + iVar1 + iVar2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_148);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
    local_118.super_VRDatum._vptr_VRDatum = local_120;
    std::__cxx11::
    _List_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::_M_clear(&local_118.value.
                super__List_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              );
    MinVR::VRDatum::~VRDatum(&local_118.super_VRDatum);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  return local_128;
}

Assistant:

int testDatumPushPopStringArray() {

  int out = 0;

  LOOP {

    MinVR::VRStringArray f;

    f.push_back("one");
    f.push_back("two");
    f.push_back("three");
    f.push_back("four");
    f.push_back("five");

    MinVR::VRDatumStringArray a = MinVR::VRDatumStringArray(f);

    a.push();

    MinVR::VRStringArray g;

    g.push_back("six");
    g.push_back("seven");
    g.push_back("eight");
    g.push_back("nine");
    g.push_back("ten");

    a.setValue(g);


    MinVR::VRStringArray b = a.getValue();

    out += b[0].compare("six");
    out += b[1].compare("seven");
    out += b[2].compare("eight");
    out += b[3].compare("nine");
    out += b[4].compare("ten");

    a.pop();

    MinVR::VRStringArray c = a.getValue();

    out += c[0].compare("one");
    out += c[1].compare("two");
    out += c[2].compare("three");
    out += c[3].compare("four");
    out += c[4].compare("five");

  }